

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sap_Emu.cpp
# Opt level: O0

void __thiscall Sap_Emu::cpu_write_(Sap_Emu *this,sap_addr_t addr,int data)

{
  long lVar1;
  undefined4 in_EDX;
  uint uVar2;
  time_t *in_RSI;
  long in_RDI;
  undefined8 in_stack_ffffffffffffffe0;
  
  uVar2 = (uint)in_RSI;
  if ((uVar2 ^ 0xd200) < 10) {
    lVar1 = in_RDI + 0x460;
    Sap_Cpu::time((Sap_Cpu *)(in_RDI + 0x1c8),in_RSI);
    Sap_Apu::write_data((Sap_Apu *)CONCAT44(uVar2,in_EDX),(blip_time_t)((ulong)in_RDI >> 0x20),
                        (uint)in_RDI,(int)((ulong)lVar1 >> 0x20));
  }
  else if (((uVar2 ^ 0xd210) < 10) && ((*(byte *)(in_RDI + 0x224) & 1) != 0)) {
    Sap_Cpu::time((Sap_Cpu *)(in_RDI + 0x1c8),in_RSI);
    Sap_Apu::write_data((Sap_Apu *)CONCAT44(uVar2,in_EDX),(blip_time_t)((ulong)in_RDI >> 0x20),
                        (uint)in_RDI,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  }
  return;
}

Assistant:

void Sap_Emu::cpu_write_( sap_addr_t addr, int data )
{
	if ( (addr ^ Sap_Apu::start_addr) <= (Sap_Apu::end_addr - Sap_Apu::start_addr) )
	{
		GME_APU_HOOK( this, addr - Sap_Apu::start_addr, data );
		apu.write_data( time() & time_mask, addr, data );
		return;
	}
	
	if ( (addr ^ (Sap_Apu::start_addr + 0x10)) <= (Sap_Apu::end_addr - Sap_Apu::start_addr) &&
			info.stereo )
	{
		GME_APU_HOOK( this, addr - 0x10 - Sap_Apu::start_addr + 10, data );
		apu2.write_data( time() & time_mask, addr ^ 0x10, data );
		return;
	}

	if ( (addr & ~0x0010) != 0xD20F || data != 0x03 )
		debug_printf( "Unmapped write $%04X <- $%02X\n", addr, data );
}